

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_setconsttable(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  SQRESULT SVar2;
  SQObject o;
  
  SVar2 = -1;
  pSVar1 = SQVM::GetUp(v,-1);
  o._type = (pSVar1->super_SQObject)._type;
  o._4_4_ = *(undefined4 *)&(pSVar1->super_SQObject).field_0x4;
  o._unVal = (pSVar1->super_SQObject)._unVal;
  if (o._type == OT_TABLE) {
    SQObjectPtr::operator=(&v->_sharedstate->_consts,&o);
    SQVM::Pop(v);
    SVar2 = 0;
  }
  else {
    sq_throwerror(v,"invalid type, expected table");
  }
  return SVar2;
}

Assistant:

SQRESULT sq_setconsttable(HSQUIRRELVM v)
{
    SQObject o = stack_get(v, -1);
    if(sq_istable(o)) {
        _ss(v)->_consts = o;
        v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v, _SC("invalid type, expected table"));
}